

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O1

uint __thiscall chipemu::implementation::nmos::read_nodes(nmos *this,uint16_t *ids,uint count)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (count != 0) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = 0;
      if (ids[uVar2] - 1 < (uint)this->desc_nodes_count) {
        uVar3 = (this->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start
                [(this->node_offsets).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start[ids[uVar2]]] >> 2 & 1;
      }
      uVar1 = uVar1 * 2 + uVar3;
      uVar2 = uVar2 + 1;
    } while (count != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned
nmos::read_nodes(const uint16_t* ids, unsigned count) const noexcept
{
    unsigned value = 0;

    for (unsigned index = 0; index < count; ++index) {
        value = (value << 1) + (get_node(ids[index]) ? 1 : 0);
    }
    return value;
}